

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::Runner::runTest(Totals *__return_storage_ptr__,Runner *this,TestCaseInfo *testInfo)

{
  IReporter *pIVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  RunningTest *pRVar6;
  IMutableContext *pIVar7;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  
  prevTotals.assertions.passed = (this->m_totals).assertions.passed;
  prevTotals.assertions.failed = (this->m_totals).assertions.failed;
  prevTotals.testCases.passed = (this->m_totals).testCases.passed;
  prevTotals.testCases.failed = (this->m_totals).testCases.failed;
  redirectedCout._M_dataplus._M_p = (pointer)&redirectedCout.field_2;
  redirectedCout._M_string_length = 0;
  redirectedCout.field_2._M_local_buf[0] = '\0';
  redirectedCerr._M_dataplus._M_p = (pointer)&redirectedCerr.field_2;
  redirectedCerr._M_string_length = 0;
  redirectedCerr.field_2._M_local_buf[0] = '\0';
  pIVar1 = (this->m_reporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar1,testInfo);
  pRVar6 = (RunningTest *)operator_new(0x68);
  RunningTest::RunningTest(pRVar6,testInfo);
  this->m_runningTest = pRVar6;
LAB_001826e7:
  do {
    SourceLineInfo::operator=
              (&(this->m_currentResult).super_ResultInfo.m_lineInfo,
               &this->m_runningTest->m_info->m_lineInfo);
    runCurrentTest(this,&redirectedCout,&redirectedCerr);
    bVar4 = RunningTest::hasUntestedSections(this->m_runningTest);
    if (bVar4) {
      if ((this->m_totals).assertions.failed != (long)(this->m_config->m_data).cutoff)
      goto LAB_001826e7;
    }
    pIVar7 = getCurrentMutableContext();
    iVar5 = (*(pIVar7->super_IContext)._vptr_IContext[5])(pIVar7);
    if (((char)iVar5 == '\0') ||
       ((this->m_totals).assertions.failed == (long)(this->m_config->m_data).cutoff)) {
      pRVar6 = this->m_runningTest;
      if (pRVar6 != (RunningTest *)0x0) {
        SectionInfo::~SectionInfo(&pRVar6->m_rootSection);
      }
      operator_delete(pRVar6,0x68);
      this->m_runningTest = (RunningTest *)0x0;
      Totals::delta(__return_storage_ptr__,&this->m_totals,&prevTotals);
      sVar2 = (__return_storage_ptr__->testCases).failed;
      sVar3 = (this->m_totals).testCases.failed;
      (this->m_totals).testCases.passed =
           (this->m_totals).testCases.passed + (__return_storage_ptr__->testCases).passed;
      (this->m_totals).testCases.failed = sVar3 + sVar2;
      pIVar1 = (this->m_reporter).m_p;
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])
                (pIVar1,testInfo,__return_storage_ptr__,&redirectedCout,&redirectedCerr);
      std::__cxx11::string::~string((string *)&redirectedCerr);
      std::__cxx11::string::~string((string *)&redirectedCout);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Totals runTest( const TestCaseInfo& testInfo ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            m_reporter->StartTestCase( testInfo );

            m_runningTest = new RunningTest( &testInfo );

            do {
                do {
                    m_currentResult.setLineInfo( m_runningTest->getTestCaseInfo().getLineInfo() );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( m_runningTest->hasUntestedSections() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            delete m_runningTest;
            m_runningTest = NULL;

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->EndTestCase( testInfo, deltaTotals, redirectedCout, redirectedCerr );
            return deltaTotals;
        }